

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  bool bVar1;
  pointer ppVar2;
  LogMessage *pLVar3;
  LogFinisher local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [13];
  LogMessage local_68;
  _Self local_30;
  _Self local_28;
  const_iterator iter;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._4_4_ = number;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type_conflict1 *)((long)&iter._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xe7);
    pLVar3 = LogMessage::operator<<
                       (&local_68,"Don\'t lookup extension types if they aren\'t present (1). ");
    LogFinisher::operator=(local_75,pLVar3);
    LogMessage::~LogMessage(&local_68);
    this_local._7_1_ = '\0';
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    if (((ppVar2->second).field_0xa & 1) != 0) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0xeb);
      pLVar3 = LogMessage::operator<<
                         (&local_b0,"Don\'t lookup extension types if they aren\'t present (2). ");
      LogFinisher::operator=(&local_b1,pLVar3);
      LogMessage::~LogMessage(&local_b0);
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    this_local._7_1_ = (ppVar2->second).type;
  }
  return this_local._7_1_;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (iter->second.is_cleared) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (2). ";
  }
  return iter->second.type;
}